

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-grammar-parser.cpp
# Opt level: O0

int main(void)

{
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *in_stack_ffffffffffffe860;
  int *in_stack_ffffffffffffe870;
  allocator_type *in_stack_ffffffffffffe878;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffe880;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  in_stack_ffffffffffffe888;
  char *in_stack_ffffffffffffe8b0;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *in_stack_ffffffffffffea50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_ffffffffffffea58;
  char *in_stack_ffffffffffffea60;
  undefined1 **local_1570;
  undefined1 **local_1540;
  undefined1 **local_1510;
  undefined1 **local_14e8;
  undefined1 **local_14c0;
  undefined1 **local_1498;
  undefined1 **local_1470;
  undefined1 **local_1448;
  undefined1 **local_1420;
  undefined1 **local_13f8;
  undefined1 **local_13d0;
  undefined1 **local_13a8;
  undefined1 **local_1380;
  undefined1 **local_1358;
  undefined1 local_1338 [536];
  undefined1 *local_1120;
  undefined8 local_1118;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined8 *local_10c0;
  undefined1 *local_10b8 [5];
  undefined1 local_1090 [40];
  undefined1 local_1068 [40];
  undefined1 local_1040 [40];
  undefined1 local_1018 [40];
  undefined1 local_ff0 [40];
  undefined1 local_fc8 [40];
  undefined1 local_fa0 [40];
  undefined1 local_f78 [40];
  undefined1 local_f50 [40];
  undefined1 local_f28 [40];
  undefined1 local_f00 [40];
  undefined1 local_ed8 [40];
  undefined8 *local_eb0;
  undefined8 local_ea8;
  undefined1 local_e80 [272];
  undefined1 *local_d70;
  undefined8 local_d68;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  undefined4 local_d2c;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined8 *local_d20;
  undefined1 *local_d18 [5];
  undefined1 local_cf0 [40];
  undefined1 local_cc8 [40];
  undefined1 local_ca0 [40];
  undefined1 local_c78 [40];
  undefined1 local_c50 [40];
  undefined1 local_c28 [40];
  undefined1 local_c00 [40];
  undefined8 *local_bd8;
  undefined8 local_bd0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 *local_b50;
  undefined8 local_b48;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined8 *local_b18;
  undefined1 *local_b10 [5];
  undefined1 local_ae8 [40];
  undefined1 local_ac0 [40];
  undefined8 *local_a98;
  undefined8 local_a90;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 *local_a38;
  undefined8 local_a30;
  undefined4 local_a0c;
  undefined8 *local_a08;
  undefined1 *local_a00 [5];
  undefined8 *local_9d8;
  undefined8 local_9d0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_968;
  undefined8 local_960;
  undefined4 local_938;
  undefined4 local_934;
  undefined8 *local_930;
  undefined1 *local_928 [5];
  undefined1 local_900 [40];
  undefined8 *local_8d8;
  undefined8 local_8d0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 *local_888;
  undefined8 local_880;
  undefined4 local_85c;
  undefined8 *local_858;
  undefined1 *local_850 [5];
  undefined8 *local_828;
  undefined8 local_820;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined4 local_798;
  undefined4 local_794;
  undefined8 *local_790;
  undefined1 *local_788 [5];
  undefined1 local_760 [40];
  undefined8 *local_738;
  undefined8 local_730;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined4 local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined8 *local_688;
  undefined1 *local_680 [5];
  undefined1 local_658 [40];
  undefined1 local_630 [40];
  undefined8 *local_608;
  undefined8 local_600;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  undefined4 local_578;
  undefined4 local_574;
  undefined8 *local_570;
  undefined1 *local_568 [5];
  undefined1 local_540 [40];
  undefined8 *local_518;
  undefined8 local_510;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined8 *local_478;
  undefined1 *local_470 [5];
  undefined1 local_448 [40];
  undefined1 local_420 [40];
  undefined8 *local_3f8;
  undefined8 local_3f0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 *local_388;
  undefined8 local_380;
  undefined4 local_358;
  undefined4 local_354;
  undefined8 *local_350;
  undefined1 *local_348 [5];
  undefined1 local_320 [40];
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined8 *local_248;
  undefined1 *local_240 [5];
  undefined1 local_218 [40];
  undefined1 local_1f0 [40];
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 local_138;
  undefined4 local_114;
  undefined8 *local_110;
  undefined1 *local_108 [5];
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 *local_a0;
  undefined8 local_98;
  undefined4 local_64;
  undefined8 *local_60;
  undefined1 *local_58 [5];
  undefined8 *local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = 0;
  verify_failure(in_stack_ffffffffffffe8b0);
  verify_failure(in_stack_ffffffffffffe8b0);
  local_60 = local_58;
  local_64 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_30 = local_58;
  local_28 = 1;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10945c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_b0 = 3;
  local_ac = 0x61;
  local_a8 = 0;
  local_a4 = 0;
  local_a0 = &local_b0;
  local_98 = 2;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x1094e0);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10953f);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109559);
  local_1358 = (undefined1 **)&local_30;
  do {
    local_1358 = local_1358 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10958e);
  } while (local_1358 != local_58);
  local_110 = local_108;
  local_114 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_e0 = local_108;
  local_d8 = 1;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10960d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_158 = 0x3300000005;
  uStack_150 = 0;
  local_168 = 1;
  uStack_160 = 0x3100000004;
  local_178 = 0x7800000006;
  uStack_170 = 0x7a00000005;
  local_188 = 0x6200000003;
  uStack_180 = 0x6400000006;
  local_198 = 0x6100000003;
  uStack_190 = 1;
  local_140 = &local_198;
  local_138 = 10;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x1096b0);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10970f);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109729);
  local_1380 = (undefined1 **)&local_e0;
  do {
    local_1380 = local_1380 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10975e);
  } while (local_1380 != local_108);
  local_248 = local_240;
  local_24c = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [2])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_248 = (undefined8 *)local_218;
  local_250 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_248 = (undefined8 *)local_1f0;
  local_254 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_1c8 = local_240;
  local_1c0 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10983f);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_298 = 0x200000002;
  uStack_290 = 1;
  local_2a8 = 0;
  uStack_2a0 = 0x100000002;
  local_2b8 = 0;
  uStack_2b0 = 0x6100000003;
  local_2c8 = 0x100000002;
  uStack_2c0 = 0x200000002;
  local_288 = 0;
  local_280 = &local_2c8;
  local_278 = 9;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x1098df);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10993e);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109958);
  local_13a8 = (undefined1 **)&local_1c8;
  do {
    local_13a8 = local_13a8 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10998d);
  } while (local_13a8 != local_240);
  local_350 = local_348;
  local_354 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_350 = (undefined8 *)local_320;
  local_358 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_2f8 = local_348;
  local_2f0 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x109a3d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_3a8 = 0x100000002;
  uStack_3a0 = 1;
  local_3b8 = 0;
  uStack_3b0 = 0x6100000003;
  local_3c8 = 0x6100000003;
  uStack_3c0 = 0x100000002;
  local_398 = 0;
  local_388 = &local_3c8;
  local_380 = 7;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x109ace);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x109b2d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109b47);
  local_13d0 = (undefined1 **)&local_2f8;
  do {
    local_13d0 = local_13d0 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x109b7c);
  } while (local_13d0 != local_348);
  local_478 = local_470;
  local_47c = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [2])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_478 = (undefined8 *)local_448;
  local_480 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_478 = (undefined8 *)local_420;
  local_484 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_3f8 = local_470;
  local_3f0 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x109c5d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_4c8 = 0x100000002;
  uStack_4c0 = 1;
  local_4d8 = 0x6100000003;
  uStack_4d0 = 0;
  local_4e8 = 0x200000002;
  uStack_4e0 = 0;
  local_4b8 = 0;
  local_4b0 = &local_4e8;
  local_4a8 = 7;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x109cee);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x109d4d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109d67);
  local_13f8 = (undefined1 **)&local_3f8;
  do {
    local_13f8 = local_13f8 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x109d9c);
  } while (local_13f8 != local_470);
  local_570 = local_568;
  local_574 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_570 = (undefined8 *)local_540;
  local_578 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_518 = local_568;
  local_510 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x109e4c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_5c8 = 0x6100000003;
  uStack_5c0 = 1;
  local_5d8 = 0x100000002;
  uStack_5d0 = 0;
  local_5b8 = 0;
  local_5a8 = &local_5d8;
  local_5a0 = 5;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x109ece);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x109f2d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x109f47);
  local_1420 = (undefined1 **)&local_518;
  do {
    local_1420 = local_1420 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x109f7c);
  } while (local_1420 != local_568);
  local_688 = local_680;
  local_68c = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [2])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_688 = (undefined8 *)local_658;
  local_690 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_688 = (undefined8 *)local_630;
  local_694 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_608 = local_680;
  local_600 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a05d);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_6d8 = 1;
  uStack_6d0 = 0;
  local_6e8 = 0x100000002;
  uStack_6e0 = 0x200000002;
  local_6f8 = 0x6100000003;
  uStack_6f0 = 0;
  local_708 = 0x200000002;
  uStack_700 = 0;
  local_6c0 = &local_708;
  local_6b8 = 8;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10a0f1);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10a150);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10a16a);
  local_1448 = (undefined1 **)&local_608;
  do {
    local_1448 = local_1448 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10a19f);
  } while (local_1448 != local_680);
  local_790 = local_788;
  local_794 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_790 = (undefined8 *)local_760;
  local_798 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_738 = local_788;
  local_730 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a24f);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_7d8 = 1;
  uStack_7d0 = 0;
  local_7e8 = 0x6100000003;
  uStack_7e0 = 0x100000002;
  local_7f8 = 0x100000002;
  uStack_7f0 = 0;
  local_7c8 = &local_7f8;
  local_7c0 = 6;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10a2d4);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10a333);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10a34d);
  local_1470 = (undefined1 **)&local_738;
  do {
    local_1470 = local_1470 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10a382);
  } while (local_1470 != local_788);
  local_858 = local_850;
  local_85c = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_828 = local_850;
  local_820 = 1;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a401);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_8a8 = 0x6100000003;
  uStack_8a0 = 0x6100000003;
  local_898 = 0;
  local_888 = &local_8a8;
  local_880 = 3;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10a474);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10a4d3);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10a4ed);
  local_1498 = (undefined1 **)&local_828;
  do {
    local_1498 = local_1498 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10a522);
  } while (local_1498 != local_850);
  local_930 = local_928;
  local_934 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_930 = (undefined8 *)local_900;
  local_938 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_8d8 = local_928;
  local_8d0 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a5d2);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_978 = 1;
  uStack_970 = 0;
  local_988 = 0x6100000003;
  uStack_980 = 0x100000002;
  local_998 = 0x100000002;
  uStack_990 = 0;
  local_9a8 = 0x6100000003;
  uStack_9a0 = 0x6100000003;
  local_968 = &local_9a8;
  local_960 = 8;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10a666);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10a6c5);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10a6df);
  local_14c0 = (undefined1 **)&local_8d8;
  do {
    local_14c0 = local_14c0 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10a714);
  } while (local_14c0 != local_928);
  local_a08 = local_a00;
  local_a0c = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_9d8 = local_a00;
  local_9d0 = 1;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a793);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_a58 = 0x6100000003;
  uStack_a50 = 0x6100000003;
  local_a68 = 0x6100000003;
  uStack_a60 = 0x6100000003;
  local_a48 = 0;
  local_a38 = &local_a68;
  local_a30 = 5;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10a815);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10a874);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10a88e);
  local_14e8 = (undefined1 **)&local_9d8;
  do {
    local_14e8 = local_14e8 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10a8c3);
  } while (local_14e8 != local_a00);
  local_b18 = local_b10;
  local_b1c = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_b18 = (undefined8 *)local_ae8;
  local_b20 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_b18 = (undefined8 *)local_ac0;
  local_b24 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_a98 = local_b10;
  local_a90 = 3;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10a9a4);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  local_b68 = 0x100000002;
  uStack_b60 = 1;
  local_b78 = 0;
  uStack_b70 = 0x6100000003;
  local_b88 = 0x6100000003;
  uStack_b80 = 1;
  local_b98 = 0x200000002;
  uStack_b90 = 0;
  local_ba8 = 0x6100000003;
  uStack_ba0 = 0x6100000003;
  local_b58 = 0;
  local_b50 = &local_ba8;
  local_b48 = 0xb;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10aa53);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10aab2);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10aacc);
  local_1510 = (undefined1 **)&local_a98;
  do {
    local_1510 = local_1510 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10ab01);
  } while (local_1510 != local_b10);
  local_d20 = local_d18;
  local_d24 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_cf0;
  local_d28 = 5;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_cc8;
  local_d2c = 6;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_ca0;
  local_d30 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_c78;
  local_d34 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_c50;
  local_d38 = 4;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_c28;
  local_d3c = 3;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_d20 = (undefined8 *)local_c00;
  local_d40 = 7;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_bd8 = local_d18;
  local_bd0 = 8;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10acd7);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  memcpy(local_e80,&DAT_00112298,0x110);
  local_d68 = 0x22;
  local_d70 = local_e80;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10ad50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10adaf);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10adc9);
  local_1540 = (undefined1 **)&local_bd8;
  do {
    local_1540 = local_1540 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10ae00);
  } while (local_1540 != local_d18);
  local_10c0 = local_10b8;
  local_10c4 = 2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_1090;
  local_10c8 = 6;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_1068;
  local_10cc = 7;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_1040;
  local_10d0 = 8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[6],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [6])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_1018;
  local_10d4 = 10;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[9],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [9])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_ff0;
  local_10d8 = 9;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[4],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [4])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_fc8;
  local_10dc = 0xb;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_fa0;
  local_10e0 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_f78;
  local_10e4 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_f50;
  local_10e8 = 5;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [7])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_f28;
  local_10ec = 4;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [5])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_f00;
  local_10f0 = 3;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[3],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [3])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_10c0 = (undefined8 *)local_ed8;
  local_10f4 = 0xc;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[6],_int,_true>
            (in_stack_ffffffffffffe880,(char (*) [6])in_stack_ffffffffffffe878,
             in_stack_ffffffffffffe870);
  local_eb0 = local_10b8;
  local_ea8 = 0xd;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)0x10b0cb);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffe880,in_stack_ffffffffffffe888,
           (allocator_type *)in_stack_ffffffffffffe878);
  memcpy(local_1338,&DAT_001123a8,0x218);
  local_1118 = 0x43;
  local_1120 = local_1338;
  std::allocator<llama_grammar_element>::allocator((allocator<llama_grammar_element> *)0x10b144);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             in_stack_ffffffffffffe880,
             (initializer_list<llama_grammar_element>)in_stack_ffffffffffffe888,
             in_stack_ffffffffffffe878);
  verify_parsing(in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,in_stack_ffffffffffffea50);
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::~vector
            (in_stack_ffffffffffffe860);
  std::allocator<llama_grammar_element>::~allocator((allocator<llama_grammar_element> *)0x10b1a3);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffe860);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)0x10b1bd);
  local_1570 = (undefined1 **)&local_eb0;
  do {
    local_1570 = local_1570 + -5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x10b1f4);
  } while (local_1570 != local_10b8);
  return 0;
}

Assistant:

int main()
{
    verify_failure(R"""(
        root ::= "a"{,}"
    )""");

    verify_failure(R"""(
        root ::= "a"{,10}"
    )""");

    verify_parsing(R"""(
        root  ::= "a"
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a" | [bdx-z] | [^1-3]
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, 'b'},
        {LLAMA_GRETYPE_CHAR_ALT, 'd'},
        {LLAMA_GRETYPE_CHAR_ALT, 'x'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR_NOT, '1'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '3'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a+
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"+
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a?
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"?
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a*
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"*
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,}
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{ 4}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,4}
    )""", {
        {"root", 0},
        {"root_1", 1},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= [0-9]+
    )""", {
        {"expr", 2},
        {"expr_5", 5},
        {"expr_6", 6},
        {"root", 0},
        {"root_1", 1},
        {"root_4", 4},
        {"term", 3},
        {"term_7", 7},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_END, 0},
        // term (index 3)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // root_4 (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_5 (index 5)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_RULE_REF, /* expr_5 */ 5},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // term_7 (index 7)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" ws term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= ident | num | "(" ws expr ")" ws
        ident ::= [a-z] [a-z0-9_]* ws
        num   ::= [0-9]+ ws
        ws    ::= [ \t\n]*
    )""", {
        {"expr", 2},
        {"expr_6", 6},
        {"expr_7", 7},
        {"ident", 8},
        {"ident_10", 10},
        {"num", 9},
        {"num_11", 11},
        {"root", 0},
        {"root_1", 1},
        {"root_5", 5},
        {"term", 4},
        {"ws", 3},
        {"ws_12", 12},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // ws (index 3)
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_END, 0},
        // term (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* ident */ 8},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_RULE_REF, /* num */ 9},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, '('},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, ')'},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // root_5 (index 5)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_END, 0},
        // expr_7 (index 7)
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ident (index 8)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // num (index 9)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // ident_10 (index 10)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_CHAR_ALT, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_CHAR_ALT, '_'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // num_11 (index 11)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ws_12 (index 12)
        {LLAMA_GRETYPE_CHAR, ' '},
        {LLAMA_GRETYPE_CHAR_ALT, '\t'},
        {LLAMA_GRETYPE_CHAR_ALT, '\n'},
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    return 0;
}